

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

mat4 * polyscope::view::getCameraPerspectiveMatrix(void)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  mat4 *in_RDI;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  float fVar8;
  double dVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar2 = (double)state::lengthScale * farClipRatio;
  dVar3 = (double)state::lengthScale * nearClipRatio;
  fVar8 = (float)bufferWidth;
  fVar10 = (float)bufferHeight;
  if (projectionMode == 1) {
    dVar6 = tan(fov * 0.017453292519943295 * 0.5);
    dVar9 = (double)state::lengthScale;
    in_RDI->value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    in_RDI->value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    *(undefined8 *)&in_RDI->value[0].field_3 = 0;
    in_RDI->value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    in_RDI->value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    in_RDI->value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    in_RDI->value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    in_RDI->value[2].field_2.z = (float)(-2.0 / (dVar2 - dVar3));
    in_RDI->value[2].field_3.w = 0.0;
    dVar6 = dVar6 * dVar9 + dVar6 * dVar9;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar6;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar6 * (double)(fVar8 / fVar10);
    auVar5 = vunpcklpd_avx(auVar12,auVar5);
    auVar13._0_8_ = auVar5._0_8_ + auVar5._0_8_;
    auVar13._8_8_ = auVar5._8_8_ + auVar5._8_8_;
    auVar12 = vshufpd_avx(auVar13,auVar13,1);
    auVar5 = vsubpd_avx(auVar5,auVar5);
    auVar7._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
    auVar7._8_8_ = auVar5._8_8_ ^ 0x8000000000000000;
    auVar5 = vdivpd_avx(auVar7,auVar13);
    in_RDI->value[0].field_0.x = (float)(2.0 / auVar13._0_8_);
    in_RDI->value[1].field_1.y = (float)(2.0 / auVar12._0_8_);
    auVar5 = vcvtpd2ps_avx(auVar5);
    uVar1 = vmovlps_avx(auVar5);
    in_RDI->value[3].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar1;
    in_RDI->value[3].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20)
    ;
    in_RDI->value[3].field_2.z = (float)(-(dVar3 + dVar2) / (dVar2 - dVar3));
    in_RDI->value[3].field_3.w = 1.0;
  }
  else {
    if (projectionMode == 0) {
      dVar6 = tan(fov * 0.017453292519943295 * 0.5);
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar3 + dVar2;
      auVar5 = vxorpd_avx512vl(auVar11,auVar4);
      in_RDI->value[0].field_0.x = (float)(1.0 / (dVar6 * (double)(fVar8 / fVar10)));
      *(undefined1 (*) [16])&in_RDI->value[0].field_1 = ZEXT416(0) << 0x20;
      in_RDI->value[1].field_1.y = (float)(1.0 / dVar6);
      *(undefined1 (*) [16])&in_RDI->value[1].field_2 = ZEXT416(0) << 0x20;
      in_RDI->value[2].field_2.z = (float)(auVar5._0_8_ / (dVar2 - dVar3));
      uVar1 = vmovlps_avx(SUB6416(ZEXT464(0xbf800000),0));
      *(undefined8 *)&in_RDI->value[2].field_3 = uVar1;
      fVar8 = 0.0;
      in_RDI->value[3].field_1.y = 0.0;
      in_RDI->value[3].field_2.z = (float)((dVar3 * dVar2 * -2.0) / (dVar2 - dVar3));
    }
    else {
      fVar8 = 1.0;
      in_RDI->value[0].field_0.x = 1.0;
      auVar5 = ZEXT816(0) << 0x20;
      *(undefined1 (*) [16])&in_RDI->value[0].field_1 = auVar5;
      in_RDI->value[1].field_1.y = 1.0;
      *(undefined1 (*) [16])&in_RDI->value[1].field_2 = auVar5;
      in_RDI->value[2].field_2.z = 1.0;
      *(undefined1 (*) [16])&in_RDI->value[2].field_3 = auVar5;
    }
    in_RDI->value[3].field_3.w = fVar8;
  }
  return in_RDI;
}

Assistant:

glm::mat4 getCameraPerspectiveMatrix() {
  double farClip = farClipRatio * state::lengthScale;
  double nearClip = nearClipRatio * state::lengthScale;
  double fovRad = glm::radians(fov);
  double aspectRatio = (float)bufferWidth / bufferHeight;
  switch (projectionMode) {
  case ProjectionMode::Perspective: {
    return glm::perspective(fovRad, aspectRatio, nearClip, farClip);
    break;
  }
  case ProjectionMode::Orthographic: {
    double vert = tan(fovRad / 2.) * state::lengthScale * 2.;
    double horiz = vert * aspectRatio;
    return glm::ortho(-horiz, horiz, -vert, vert, nearClip, farClip);
    break;
  }
  }
  return glm::mat4(1.0f); // unreachable
}